

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

long __thiscall mkvparser::VideoTrack::Seek(VideoTrack *this,longlong time_ns,BlockEntry **pResult)

{
  Cluster **ppCVar1;
  Cluster *pCVar2;
  Segment *pSVar3;
  Cluster **ppCVar4;
  long lVar5;
  undefined1 auVar6 [16];
  Cluster **ppCVar7;
  int iVar8;
  long lVar9;
  undefined4 extraout_var;
  longlong lVar10;
  BlockEntry *pBVar11;
  Cluster **ppCVar12;
  Cluster **ppCVar13;
  Cluster **ppCVar14;
  
  lVar9 = Track::GetFirst(&this->super_Track,pResult);
  if (-1 < lVar9) {
    if (*pResult == (BlockEntry *)0x0) {
      __assert_fail("pResult",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x155c,
                    "virtual long mkvparser::VideoTrack::Seek(long long, const BlockEntry *&) const"
                   );
    }
    iVar8 = (*(*pResult)->_vptr_BlockEntry[3])();
    if (iVar8 != 0) {
      pCVar2 = (*pResult)->m_pCluster;
      if (pCVar2 == (Cluster *)0x0) {
        __assert_fail("pCluster",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1562,
                      "virtual long mkvparser::VideoTrack::Seek(long long, const BlockEntry *&) const"
                     );
      }
      if (pCVar2->m_index < 0) {
        __assert_fail("pCluster->GetIndex() >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1563,
                      "virtual long mkvparser::VideoTrack::Seek(long long, const BlockEntry *&) const"
                     );
      }
      iVar8 = (*(*pResult)->_vptr_BlockEntry[2])();
      lVar10 = Block::GetTime((Block *)CONCAT44(extraout_var,iVar8),pCVar2);
      if (lVar10 < time_ns) {
        pSVar3 = (this->super_Track).m_pSegment;
        ppCVar4 = pSVar3->m_clusters;
        if (ppCVar4 == (Cluster **)0x0) {
          __assert_fail("clusters",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1569,
                        "virtual long mkvparser::VideoTrack::Seek(long long, const BlockEntry *&) const"
                       );
        }
        lVar9 = pSVar3->m_clusterCount;
        if (lVar9 < 1) {
          __assert_fail("count > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x156c,
                        "virtual long mkvparser::VideoTrack::Seek(long long, const BlockEntry *&) const"
                       );
        }
        lVar5 = pCVar2->m_index;
        if (ppCVar4[lVar5] != pCVar2) {
          __assert_fail("*i == pCluster",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1570,
                        "virtual long mkvparser::VideoTrack::Seek(long long, const BlockEntry *&) const"
                       );
        }
        lVar10 = Cluster::GetTime(pCVar2);
        if (time_ns < lVar10) {
          __assert_fail("pCluster->GetTime() <= time_ns",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1571,
                        "virtual long mkvparser::VideoTrack::Seek(long long, const BlockEntry *&) const"
                       );
        }
        ppCVar1 = ppCVar4 + lVar5;
        ppCVar13 = ppCVar1;
        ppCVar14 = ppCVar4 + lVar9;
        while (ppCVar13 < ppCVar14) {
          auVar6._8_8_ = (long)ppCVar14 - (long)ppCVar13 >> 0x3f;
          auVar6._0_8_ = (long)ppCVar14 - (long)ppCVar13 >> 3;
          ppCVar12 = ppCVar13 + SUB168(auVar6 / SEXT816(2),0);
          if (ppCVar14 <= ppCVar12) {
            __assert_fail("mid < hi",
                          "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x157f,
                          "virtual long mkvparser::VideoTrack::Seek(long long, const BlockEntry *&) const"
                         );
          }
          pCVar2 = *ppCVar12;
          if (pCVar2 == (Cluster *)0x0) {
            __assert_fail("pCluster",
                          "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x1582,
                          "virtual long mkvparser::VideoTrack::Seek(long long, const BlockEntry *&) const"
                         );
          }
          if (pCVar2->m_index < 0) {
            __assert_fail("pCluster->GetIndex() >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x1583,
                          "virtual long mkvparser::VideoTrack::Seek(long long, const BlockEntry *&) const"
                         );
          }
          if (pCVar2->m_index !=
              (long)ppCVar12 - (long)((this->super_Track).m_pSegment)->m_clusters >> 3) {
            __assert_fail("pCluster->GetIndex() == long(mid - m_pSegment->m_clusters)",
                          "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x1584,
                          "virtual long mkvparser::VideoTrack::Seek(long long, const BlockEntry *&) const"
                         );
          }
          lVar10 = Cluster::GetTime(pCVar2);
          ppCVar7 = ppCVar12 + 1;
          if (time_ns < lVar10) {
            ppCVar14 = ppCVar12;
            ppCVar7 = ppCVar13;
          }
          ppCVar13 = ppCVar7;
          if (ppCVar14 < ppCVar13) {
            __assert_fail("lo <= hi",
                          "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x158d,
                          "virtual long mkvparser::VideoTrack::Seek(long long, const BlockEntry *&) const"
                         );
          }
        }
        if (ppCVar13 != ppCVar14) {
          __assert_fail("lo == hi",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1590,
                        "virtual long mkvparser::VideoTrack::Seek(long long, const BlockEntry *&) const"
                       );
        }
        if (ppCVar13 <= ppCVar1) {
          __assert_fail("lo > i",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1591,
                        "virtual long mkvparser::VideoTrack::Seek(long long, const BlockEntry *&) const"
                       );
        }
        if (ppCVar4 + lVar9 < ppCVar13) {
          __assert_fail("lo <= j",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1592,
                        "virtual long mkvparser::VideoTrack::Seek(long long, const BlockEntry *&) const"
                       );
        }
        pCVar2 = ppCVar13[-1];
        if (pCVar2 == (Cluster *)0x0) {
          __assert_fail("pCluster",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1595,
                        "virtual long mkvparser::VideoTrack::Seek(long long, const BlockEntry *&) const"
                       );
        }
        lVar10 = Cluster::GetTime(pCVar2);
        if (time_ns < lVar10) {
          __assert_fail("pCluster->GetTime() <= time_ns",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1596,
                        "virtual long mkvparser::VideoTrack::Seek(long long, const BlockEntry *&) const"
                       );
        }
        pBVar11 = Cluster::GetEntry(pCVar2,&this->super_Track,time_ns);
        *pResult = pBVar11;
        if ((pBVar11 == (BlockEntry *)0x0) ||
           (iVar8 = (*pBVar11->_vptr_BlockEntry[3])(pBVar11), iVar8 == 0)) {
          ppCVar13 = ppCVar13 + -1;
          while (ppCVar13 != ppCVar1) {
            pCVar2 = ppCVar13[-1];
            if (pCVar2 == (Cluster *)0x0) {
              __assert_fail("pCluster",
                            "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                            ,0x159f,
                            "virtual long mkvparser::VideoTrack::Seek(long long, const BlockEntry *&) const"
                           );
            }
            lVar10 = Cluster::GetTime(pCVar2);
            if (time_ns < lVar10) {
              __assert_fail("pCluster->GetTime() <= time_ns",
                            "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                            ,0x15a0,
                            "virtual long mkvparser::VideoTrack::Seek(long long, const BlockEntry *&) const"
                           );
            }
            ppCVar13 = ppCVar13 + -1;
            pBVar11 = Cluster::GetEntry(pCVar2,&this->super_Track,time_ns);
            *pResult = pBVar11;
            if ((pBVar11 != (BlockEntry *)0x0) &&
               (iVar8 = (*pBVar11->_vptr_BlockEntry[3])(pBVar11), iVar8 != 0)) {
              return 0;
            }
          }
          *pResult = &(this->super_Track).m_eos.super_BlockEntry;
        }
      }
    }
    lVar9 = 0;
  }
  return lVar9;
}

Assistant:

long VideoTrack::Seek(long long time_ns, const BlockEntry*& pResult) const {
  const long status = GetFirst(pResult);

  if (status < 0)  // buffer underflow, etc
    return status;

  assert(pResult);

  if (pResult->EOS())
    return 0;

  const Cluster* pCluster = pResult->GetCluster();
  assert(pCluster);
  assert(pCluster->GetIndex() >= 0);

  if (time_ns <= pResult->GetBlock()->GetTime(pCluster))
    return 0;

  Cluster** const clusters = m_pSegment->m_clusters;
  assert(clusters);

  const long count = m_pSegment->GetCount();  // loaded only, not pre-loaded
  assert(count > 0);

  Cluster** const i = clusters + pCluster->GetIndex();
  assert(i);
  assert(*i == pCluster);
  assert(pCluster->GetTime() <= time_ns);

  Cluster** const j = clusters + count;

  Cluster** lo = i;
  Cluster** hi = j;

  while (lo < hi) {
    // INVARIANT:
    //[i, lo) <= time_ns
    //[lo, hi) ?
    //[hi, j)  > time_ns

    Cluster** const mid = lo + (hi - lo) / 2;
    assert(mid < hi);

    pCluster = *mid;
    assert(pCluster);
    assert(pCluster->GetIndex() >= 0);
    assert(pCluster->GetIndex() == long(mid - m_pSegment->m_clusters));

    const long long t = pCluster->GetTime();

    if (t <= time_ns)
      lo = mid + 1;
    else
      hi = mid;

    assert(lo <= hi);
  }

  assert(lo == hi);
  assert(lo > i);
  assert(lo <= j);

  pCluster = *--lo;
  assert(pCluster);
  assert(pCluster->GetTime() <= time_ns);

  pResult = pCluster->GetEntry(this, time_ns);

  if ((pResult != 0) && !pResult->EOS())  // found a keyframe
    return 0;

  while (lo != i) {
    pCluster = *--lo;
    assert(pCluster);
    assert(pCluster->GetTime() <= time_ns);

    pResult = pCluster->GetEntry(this, time_ns);

    if ((pResult != 0) && !pResult->EOS())
      return 0;
  }

  // weird: we're on the first cluster, but no keyframe found
  // should never happen but we must return something anyway

  pResult = GetEOS();
  return 0;
}